

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O0

PSNode * __thiscall
dg::pta::LLVMPointerGraphBuilder::createUnknownCall(LLVMPointerGraphBuilder *this)

{
  PSNode *this_00;
  PSNode *call;
  Pointer *in_stack_ffffffffffffffe8;
  PointerGraph *in_stack_fffffffffffffff0;
  
  this_00 = PointerGraph::create<(dg::pta::PSNodeType)8>(in_stack_fffffffffffffff0);
  PSNode::setPairedNode(this_00,this_00);
  PSNode::addPointsTo(this_00,in_stack_ffffffffffffffe8);
  return this_00;
}

Assistant:

PSNode *LLVMPointerGraphBuilder::createUnknownCall() {
    // This assertion must not hold if the call is wrapped
    // inside bitcast - it defaults to int, but is bitcased
    // to pointer
    // assert(CInst->getType()->isPointerTy());
    PSNode *call = PS.create<PSNodeType::CALL>();
    call->setPairedNode(call);

    // the only thing that the node will point at
    call->addPointsTo(UnknownPointer);

    return call;
}